

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,float value)

{
  int32 iVar1;
  IMkvWriter *in_RSI;
  uint64 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_stack_ffffffffffffffe0;
  float f;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (in_RDI == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = WriteID((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    in_RDI);
    f = (float)(in_RDI >> 0x20);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(in_RSI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        iVar1 = SerializeFloat((IMkvWriter *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),f);
        if (iVar1 == 0) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, float value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, 4))
    return false;

  if (SerializeFloat(writer, value))
    return false;

  return true;
}